

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLOptions.h
# Opt level: O0

string * __thiscall CLOptions::AsString(CLOptions *this,string *param_name)

{
  size_type sVar1;
  ostream *poVar2;
  key_type *in_RDX;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>_>
  *in_RSI;
  string *in_RDI;
  CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffffa8;
  string *psVar3;
  allocator local_19;
  
  psVar3 = in_RDI;
  sVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>_>
          ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>_>
                   *)in_RDI,(key_type *)in_RDI);
  if (sVar1 == 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"[ERROR] CLOptions::AsString() :: Parameter \"");
    poVar2 = std::operator<<(poVar2,(string *)in_RDX);
    poVar2 = std::operator<<(poVar2,"\" is not a string!");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,(char *)0x0,&local_19);
    std::allocator<char>::~allocator((allocator<char> *)&local_19);
  }
  else {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>_>
    ::operator[](in_RSI,in_RDX);
    CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    getValue(in_stack_ffffffffffffffa8);
  }
  return psVar3;
}

Assistant:

std::string CLOptions::AsString(const std::string& param_name)
{
    if (params_strings.count(param_name) == 0) {
        std::cerr << "[ERROR] CLOptions::AsString() :: Parameter \"" << param_name << "\" is not a string!" << std::endl;
        return 0 ;
    } else {
        return params_strings[param_name]->getValue();
    }
}